

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O0

void __thiscall
Js::SerializationCloner<Js::StreamWriter>::WriteTypedArray
          (SerializationCloner<Js::StreamWriter> *this,SrcTypeId typeId,Src src)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Src src_local;
  SrcTypeId typeId_local;
  SerializationCloner<Js::StreamWriter> *this_local;
  
  switch(typeId) {
  case TypeIds_Int8Array:
    BVar3 = TypedArray<char,_false,_true>::HasVirtualTableInfo(src);
    if (BVar3 == 0) {
      WriteTypedArray<char,false,false>(this,src);
    }
    else {
      WriteTypedArray<char,false,true>(this,src);
    }
    break;
  case TypeIds_Uint8Array:
    BVar3 = TypedArray<unsigned_char,_false,_true>::HasVirtualTableInfo(src);
    if (BVar3 == 0) {
      WriteTypedArray<unsigned_char,false,false>(this,src);
    }
    else {
      WriteTypedArray<unsigned_char,false,true>(this,src);
    }
    break;
  case TypeIds_Uint8ClampedArray:
    BVar3 = TypedArray<unsigned_char,_true,_true>::HasVirtualTableInfo(src);
    if (BVar3 == 0) {
      WriteTypedArray<unsigned_char,true,false>(this,src);
    }
    else {
      WriteTypedArray<unsigned_char,true,true>(this,src);
    }
    break;
  case TypeIds_Int16Array:
    BVar3 = TypedArray<short,_false,_true>::HasVirtualTableInfo(src);
    if (BVar3 == 0) {
      WriteTypedArray<short,false,false>(this,src);
    }
    else {
      WriteTypedArray<short,false,true>(this,src);
    }
    break;
  case TypeIds_Uint16Array:
    BVar3 = TypedArray<unsigned_short,_false,_true>::HasVirtualTableInfo(src);
    if (BVar3 == 0) {
      WriteTypedArray<unsigned_short,false,false>(this,src);
    }
    else {
      WriteTypedArray<unsigned_short,false,true>(this,src);
    }
    break;
  case TypeIds_Int32Array:
    BVar3 = TypedArray<int,_false,_true>::HasVirtualTableInfo(src);
    if (BVar3 == 0) {
      WriteTypedArray<int,false,false>(this,src);
    }
    else {
      WriteTypedArray<int,false,true>(this,src);
    }
    break;
  case TypeIds_Uint32Array:
    BVar3 = TypedArray<unsigned_int,_false,_true>::HasVirtualTableInfo(src);
    if (BVar3 == 0) {
      WriteTypedArray<unsigned_int,false,false>(this,src);
    }
    else {
      WriteTypedArray<unsigned_int,false,true>(this,src);
    }
    break;
  case TypeIds_Float32Array:
    BVar3 = TypedArray<float,_false,_true>::HasVirtualTableInfo(src);
    if (BVar3 == 0) {
      WriteTypedArray<float,false,false>(this,src);
    }
    else {
      WriteTypedArray<float,false,true>(this,src);
    }
    break;
  case TypeIds_Float64Array:
    BVar3 = TypedArray<double,_false,_true>::HasVirtualTableInfo(src);
    if (BVar3 == 0) {
      WriteTypedArray<double,false,false>(this,src);
    }
    else {
      WriteTypedArray<double,false,true>(this,src);
    }
    break;
  default:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/SCACore/SCASerialization.cpp"
                                ,0x202,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
    break;
  case TypeIds_DataView:
    WriteTypedArray<Js::DataView,false,false>(this,src);
  }
  return;
}

Assistant:

void SerializationCloner<Writer>::WriteTypedArray(SrcTypeId typeId, Src src) const
    {
        switch (typeId)
        {
        case TypeIds_Int8Array:
            if (Int8VirtualArray::HasVirtualTableInfo(src))
            {
                WriteTypedArray<int8, false, true>(src);
            }
            else
            {
                WriteTypedArray<int8, false>(src);
            }
            break;

        case TypeIds_Uint8Array:
            if (Uint8VirtualArray::HasVirtualTableInfo(src))
            {
                WriteTypedArray<uint8, false, true>(src);
            }
            else
            {
                WriteTypedArray<uint8, false>(src);
            }
            break;

        case TypeIds_Uint8ClampedArray:
            if (Uint8ClampedVirtualArray::HasVirtualTableInfo(src))
            {
                WriteTypedArray<uint8, true, true>(src);
            }
            else
            {
                WriteTypedArray<uint8, true>(src);
            }
            break;

        case TypeIds_Int16Array:
            if (Int16VirtualArray::HasVirtualTableInfo(src))
            {
                WriteTypedArray<int16, false, true>(src);
            }
            else
            {
                WriteTypedArray<int16, false>(src);
            }
            break;

        case TypeIds_Uint16Array:
            if (Uint16VirtualArray::HasVirtualTableInfo(src))
            {
                WriteTypedArray<uint16, false, true>(src);
            }
            else
            {
                WriteTypedArray<uint16, false>(src);
            }
            break;

        case TypeIds_Int32Array:
            if (Int32VirtualArray::HasVirtualTableInfo(src))
            {
                WriteTypedArray<int32, false, true>(src);
            }
            else
            {
                WriteTypedArray<int32, false>(src);
            }
            break;

        case TypeIds_Uint32Array:
            if (Uint32VirtualArray::HasVirtualTableInfo(src))
            {
                WriteTypedArray<uint32, false, true>(src);
            }
            else
            {
                WriteTypedArray<uint32, false>(src);
            }
            break;

        case TypeIds_Float32Array:
            if (Float32VirtualArray::HasVirtualTableInfo(src))
            {
                WriteTypedArray<float, false, true>(src);
            }
            else
            {
                WriteTypedArray<float, false>(src);
            }
            break;

        case TypeIds_Float64Array:
            if (Float64VirtualArray::HasVirtualTableInfo(src))
            {
                WriteTypedArray<double, false, true>(src);
            }
            else
            {
                WriteTypedArray<double, false>(src);
            }
            break;

        case TypeIds_DataView:
            WriteTypedArray<DataView, false>(src);
            break;

        default:
            Assert(false);
        }
    }